

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

Instr * __thiscall
IRBuilder::BuildProfiledCallI
          (IRBuilder *this,OpCode opcode,uint32 offset,RegSlot returnValue,RegSlot function,
          ArgSlot argCount,ProfileId profileId,CallFlags flags,InlineCacheIndex inlineCacheIndex)

{
  uint32 *puVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  BOOLEAN BVar5;
  uint uVar6;
  uint uVar7;
  BVIndex BVar8;
  undefined4 *puVar9;
  JITTimeProfileInfo *pJVar10;
  FunctionJITTimeInfo *pFVar11;
  Instr *pIVar12;
  BVFixed *pBVar13;
  uint i;
  undefined6 in_register_00000032;
  undefined6 in_register_0000008a;
  byte bVar14;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  RegSlot local_40;
  uint32 local_3c;
  undefined4 local_38;
  OpCode local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  OpCode newOpcode;
  ValueType returnType;
  
  local_38 = (undefined4)CONCAT62(in_register_0000008a,argCount);
  local_40 = returnValue;
  local_3c = offset;
  ValueType::ValueType((ValueType *)&local_32[0].field_0);
  iVar3 = (int)CONCAT62(in_register_00000032,opcode);
  local_34 = opcode;
  if ((iVar3 - 0xc5U < 2) || (iVar3 == 0x161)) {
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(&local_34);
    if ((local_34 != NewScObject) && (local_34 != NewScObjectSpread)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x194b,
                         "(newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread)"
                         ,
                         "newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread"
                        );
      if (!bVar4) goto LAB_0049904b;
      *puVar9 = 0;
    }
    bVar4 = Func::HasProfileInfo(this->m_func);
    if (!bVar4) {
      bVar14 = 0;
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(UninitializedObject);
      goto LAB_00498e96;
    }
    pJVar10 = Func::GetReadOnlyProfileInfo(this->m_func);
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         JITTimeProfileInfo::GetReturnType(pJVar10,opcode,profileId);
  }
  else {
    bVar4 = Func::HasProfileInfo(this->m_func);
    i = (uint)profileId;
    if (bVar4) {
      pJVar10 = Func::GetReadOnlyProfileInfo(this->m_func);
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           JITTimeProfileInfo::GetReturnType(pJVar10,opcode,profileId);
    }
    if (opcode < ProfiledReturnTypeCallI) {
      local_34 = Js::OpCodeUtil::ConvertProfiledCallOpToNonProfiled(opcode);
      bVar4 = DoBailOnNoProfile(this);
      if (bVar4) {
        pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        if (pFVar11 == (FunctionJITTimeInfo *)0x0) {
LAB_0049902c:
          bVar14 = 0;
        }
        else {
          pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          bVar4 = IsLoopBody(this);
          if (bVar4) {
            uVar6 = Func::GetSourceContextId(this->m_func);
            uVar7 = Func::GetLocalFunctionId(this->m_func);
            bVar4 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_01441eb0,InlineInJitLoopBodyPhase,uVar6,uVar7);
            if ((pFVar11 != (FunctionJITTimeInfo *)0x0) && (!bVar4)) goto LAB_00498f3a;
LAB_00499024:
            this->callTreeHasSomeProfileInfo = true;
            goto LAB_0049902c;
          }
          if (pFVar11 == (FunctionJITTimeInfo *)0x0) goto LAB_00499024;
LAB_00498f3a:
          pBVar13 = FunctionJITTimeInfo::GetInlineesBV(pFVar11);
          if (pBVar13 == (BVFixed *)0x0) goto LAB_00499024;
          pBVar13 = FunctionJITTimeInfo::GetInlineesBV(pFVar11);
          BVar8 = BVFixed::Length(pBVar13);
          if (BVar8 <= i) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1968,"(profileId < inlinerData->GetInlineesBV()->Length())",
                               "profileId < inlinerData->GetInlineesBV()->Length()");
            if (!bVar4) {
LAB_0049904b:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar9 = 0;
          }
          pBVar13 = FunctionJITTimeInfo::GetInlineesBV(pFVar11);
          BVar5 = BVFixed::Test(pBVar13,i);
          if (BVar5 != '\0') {
            uVar6 = Func::GetSourceContextId(this->m_func->topFunc);
            uVar7 = Func::GetLocalFunctionId(this->m_func->topFunc);
            i = 0x37;
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01439100,BailOnNoProfilePhase,uVar6,uVar7);
            if ((!bVar4) ||
               ((-1 < (int)DAT_01441e88 && (this->m_func->m_callSiteCount < DAT_01441e88))))
            goto LAB_00499024;
          }
          InsertBailOnNoProfile(this,i);
          bVar14 = 1;
        }
        puVar1 = &this->m_func->m_callSiteCount;
        *puVar1 = *puVar1 + 1;
        goto LAB_00498e96;
      }
    }
  }
  bVar14 = 0;
LAB_00498e96:
  pIVar12 = BuildCallI_Helper(this,local_34,local_3c,local_40,function,(ArgSlot)local_38,profileId,
                              flags,inlineCacheIndex);
  pIVar12->field_0x38 = pIVar12->field_0x38 & 0xfe | bVar14;
  if (pIVar12->m_dst != (Opnd *)0x0) {
    local_44 = (pIVar12->m_dst->m_valueType).field_0;
    bVar4 = ValueType::IsUninitialized((ValueType *)&local_44.field_0);
    if (!bVar4) {
      local_42 = (pIVar12->m_dst->m_valueType).field_0;
      bVar4 = ValueType::operator==((ValueType *)&local_42.field_0,(ValueType)0x10);
      if (!bVar4) {
        return pIVar12;
      }
    }
    IR::Opnd::SetValueType(pIVar12->m_dst,(ValueType)local_32[0].field_0);
  }
  return pIVar12;
}

Assistant:

IR::Instr *
IRBuilder::BuildProfiledCallI(Js::OpCode opcode, uint32 offset, Js::RegSlot returnValue, Js::RegSlot function,
                            Js::ArgSlot argCount, Js::ProfileId profileId, Js::CallFlags flags, Js::InlineCacheIndex inlineCacheIndex)
{
    Js::OpCode newOpcode;
    ValueType returnType;
    bool isProtectedByNoProfileBailout = false;

    if (opcode == Js::OpCode::ProfiledNewScObject || opcode == Js::OpCode::ProfiledNewScObjectWithICIndex
        || opcode == Js::OpCode::ProfiledNewScObjectSpread)
    {
        newOpcode = opcode;
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
        Assert(newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread);
        if (!this->m_func->HasProfileInfo())
        {
            returnType = ValueType::GetObject(ObjectType::UninitializedObject);
        }
        else
        {
            // If we have profile data, make use of it
            returnType = this->m_func->GetReadOnlyProfileInfo()->GetReturnType(opcode, profileId);
        }
    }
    else
    {
        if (this->m_func->HasProfileInfo())
        {
            returnType = this->m_func->GetReadOnlyProfileInfo()->GetReturnType(opcode, profileId);
        }

        if (opcode < Js::OpCode::ProfiledReturnTypeCallI)
        {
            newOpcode = Js::OpCodeUtil::ConvertProfiledCallOpToNonProfiled(opcode);
            if(DoBailOnNoProfile())
            {
                if(this->m_func->GetWorkItem()->GetJITTimeInfo())
                {
                    const FunctionJITTimeInfo *inlinerData = this->m_func->GetWorkItem()->GetJITTimeInfo();
                    if (!(this->IsLoopBody() && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->m_func))
                        && inlinerData && inlinerData->GetInlineesBV())
                    {
                        AssertOrFailFast(profileId < inlinerData->GetInlineesBV()->Length());
                        if (!inlinerData->GetInlineesBV()->Test(profileId)
#if DBG
                            || (PHASE_STRESS(Js::BailOnNoProfilePhase, this->m_func->GetTopFunc())
                                && (CONFIG_FLAG(SkipFuncCountForBailOnNoProfile) < 0
                                    || this->m_func->m_callSiteCount >= (uint)CONFIG_FLAG(SkipFuncCountForBailOnNoProfile)))
#endif
                            )
                        {
                            this->InsertBailOnNoProfile(offset);
                            isProtectedByNoProfileBailout = true;
                        }
                    }

                    if (!isProtectedByNoProfileBailout)
                    {
                        this->callTreeHasSomeProfileInfo = true;
                    }
                }
#if DBG
                this->m_func->m_callSiteCount++;
#endif
            }
        }
        else
        {
            // Changing this opcode into a non ReturnTypeCall* opcode is done in BuildCallI_Helper
            newOpcode = opcode;
        }
    }
    IR::Instr * callInstr = BuildCallI_Helper(newOpcode, offset, returnValue, function, argCount, profileId, flags, inlineCacheIndex);
    callInstr->isCallInstrProtectedByNoProfileBailout = isProtectedByNoProfileBailout;

    if (callInstr->GetDst() && (callInstr->GetDst()->GetValueType().IsUninitialized() || callInstr->GetDst()->GetValueType() == ValueType::UninitializedObject))
    {
        callInstr->GetDst()->SetValueType(returnType);
    }
    return callInstr;
}